

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake_test.c
# Opt level: O2

int main(void)

{
  uint8_t auVar1 [32];
  uint8_t auVar2 [32];
  uint8_t auVar3 [32];
  uint8_t auVar4 [32];
  int iVar5;
  char *pcVar6;
  int local_63c;
  uint8_t data1 [8];
  uint8_t data2 [8];
  uint8_t out2 [32];
  uint8_t output4 [32];
  uint8_t output3 [32];
  uint8_t output2 [32];
  uint8_t output1 [32];
  uint8_t out1 [32];
  uint8_t *output_ptrs [4];
  uint8_t *data_ptrs [4];
  hash_context local_528;
  hash_context ctx1;
  hash_context_x4 ctx;
  
  printf("testing SHAKE128x4 ...");
  output_ptrs[0] = output1;
  output_ptrs[1] = output2;
  output_ptrs[2] = output3;
  output_ptrs[3] = output4;
  data1[0] = '\x01';
  data1[1] = '#';
  data1[2] = 'E';
  data1[3] = 'g';
  data1[4] = 0x89;
  data1[5] = 0xab;
  data1[6] = 0xcd;
  data1[7] = 0xef;
  data2[0] = 0xfe;
  data2[1] = 0xdc;
  data2[2] = 0xba;
  data2[3] = 0x98;
  data2[4] = 'v';
  data2[5] = 'T';
  data2[6] = '2';
  data2[7] = '\x10';
  output2 = (uint8_t  [32])ZEXT1632(ZEXT816(0) << 0x40);
  output4 = (uint8_t  [32])ZEXT1632(ZEXT816(0) << 0x40);
  output3 = output4;
  output1 = output2;
  data_ptrs[0] = data1;
  data_ptrs[1] = data2;
  data_ptrs[2] = data2;
  data_ptrs[3] = data1;
  hash_init_x4(&ctx,0x20);
  Keccak_HashUpdatetimes4(&ctx,data_ptrs,0x40);
  hash_final_x4(&ctx);
  Keccak_HashSqueezetimes4(&ctx,output_ptrs,0x100);
  out1[0] = '\0';
  out1[1] = '\0';
  out1[2] = '\0';
  out1[3] = '\0';
  out1[4] = '\0';
  out1[5] = '\0';
  out1[6] = '\0';
  out1[7] = '\0';
  out1[8] = '\0';
  out1[9] = '\0';
  out1[10] = '\0';
  out1[0xb] = '\0';
  out1[0xc] = '\0';
  out1[0xd] = '\0';
  out1[0xe] = '\0';
  out1[0xf] = '\0';
  out1[0x10] = '\0';
  out1[0x11] = '\0';
  out1[0x12] = '\0';
  out1[0x13] = '\0';
  out1[0x14] = '\0';
  out1[0x15] = '\0';
  out1[0x16] = '\0';
  out1[0x17] = '\0';
  out1[0x18] = '\0';
  out1[0x19] = '\0';
  out1[0x1a] = '\0';
  out1[0x1b] = '\0';
  out1[0x1c] = '\0';
  out1[0x1d] = '\0';
  out1[0x1e] = '\0';
  out1[0x1f] = '\0';
  out2[0] = '\0';
  out2[1] = '\0';
  out2[2] = '\0';
  out2[3] = '\0';
  out2[4] = '\0';
  out2[5] = '\0';
  out2[6] = '\0';
  out2[7] = '\0';
  out2[8] = '\0';
  out2[9] = '\0';
  out2[10] = '\0';
  out2[0xb] = '\0';
  out2[0xc] = '\0';
  out2[0xd] = '\0';
  out2[0xe] = '\0';
  out2[0xf] = '\0';
  out2[0x10] = '\0';
  out2[0x11] = '\0';
  out2[0x12] = '\0';
  out2[0x13] = '\0';
  out2[0x14] = '\0';
  out2[0x15] = '\0';
  out2[0x16] = '\0';
  out2[0x17] = '\0';
  out2[0x18] = '\0';
  out2[0x19] = '\0';
  out2[0x1a] = '\0';
  out2[0x1b] = '\0';
  out2[0x1c] = '\0';
  out2[0x1d] = '\0';
  out2[0x1e] = '\0';
  out2[0x1f] = '\0';
  hash_init(&ctx1,0x20);
  Keccak_HashUpdate(&ctx1,data1,0x40);
  hash_final(&ctx1);
  Keccak_HashSqueeze(&ctx1,out1,0x100);
  hash_init(&local_528,0x20);
  Keccak_HashUpdate(&local_528,data2,0x40);
  hash_final(&local_528);
  Keccak_HashSqueeze(&local_528,out2,0x100);
  auVar3[8] = out1[8];
  auVar3[9] = out1[9];
  auVar3[10] = out1[10];
  auVar3[0xb] = out1[0xb];
  auVar3[0xc] = out1[0xc];
  auVar3[0xd] = out1[0xd];
  auVar3[0xe] = out1[0xe];
  auVar3[0xf] = out1[0xf];
  auVar3[0] = out1[0];
  auVar3[1] = out1[1];
  auVar3[2] = out1[2];
  auVar3[3] = out1[3];
  auVar3[4] = out1[4];
  auVar3[5] = out1[5];
  auVar3[6] = out1[6];
  auVar3[7] = out1[7];
  auVar3[0x10] = out1[0x10];
  auVar3[0x11] = out1[0x11];
  auVar3[0x12] = out1[0x12];
  auVar3[0x13] = out1[0x13];
  auVar3[0x14] = out1[0x14];
  auVar3[0x15] = out1[0x15];
  auVar3[0x16] = out1[0x16];
  auVar3[0x17] = out1[0x17];
  auVar3[0x18] = out1[0x18];
  auVar3[0x19] = out1[0x19];
  auVar3[0x1a] = out1[0x1a];
  auVar3[0x1b] = out1[0x1b];
  auVar3[0x1c] = out1[0x1c];
  auVar3[0x1d] = out1[0x1d];
  auVar3[0x1e] = out1[0x1e];
  auVar3[0x1f] = out1[0x1f];
  if ((((auVar3 == _DAT_00113020) &&
       (auVar1[8] = out2[8], auVar1[9] = out2[9], auVar1[10] = out2[10], auVar1[0xb] = out2[0xb],
       auVar1[0xc] = out2[0xc], auVar1[0xd] = out2[0xd], auVar1[0xe] = out2[0xe],
       auVar1[0xf] = out2[0xf], auVar1[0] = out2[0], auVar1[1] = out2[1], auVar1[2] = out2[2],
       auVar1[3] = out2[3], auVar1[4] = out2[4], auVar1[5] = out2[5], auVar1[6] = out2[6],
       auVar1[7] = out2[7], auVar1[0x10] = out2[0x10], auVar1[0x11] = out2[0x11],
       auVar1[0x12] = out2[0x12], auVar1[0x13] = out2[0x13], auVar1[0x14] = out2[0x14],
       auVar1[0x15] = out2[0x15], auVar1[0x16] = out2[0x16], auVar1[0x17] = out2[0x17],
       auVar1[0x18] = out2[0x18], auVar1[0x19] = out2[0x19], auVar1[0x1a] = out2[0x1a],
       auVar1[0x1b] = out2[0x1b], auVar1[0x1c] = out2[0x1c], auVar1[0x1d] = out2[0x1d],
       auVar1[0x1e] = out2[0x1e], auVar1[0x1f] = out2[0x1f], auVar1 == _DAT_00113040)) &&
      (output1 == _DAT_00113020)) && ((output2 == _DAT_00113040 && (output3 == _DAT_00113040)))) {
    pcVar6 = "OK";
    if (output4 != _DAT_00113020) {
      pcVar6 = "FAILED";
    }
    local_63c = -(uint)(output4 != _DAT_00113020);
  }
  else {
    local_63c = -1;
    pcVar6 = "FAILED";
  }
  puts(pcVar6);
  printf("testing SHAKE256x4 ...");
  output_ptrs[0] = output1;
  data2[0] = 0xfe;
  data2[1] = 0xdc;
  data2[2] = 0xba;
  data2[3] = 0x98;
  data2[4] = 'v';
  data2[5] = 'T';
  data2[6] = '2';
  data2[7] = '\x10';
  output_ptrs[1] = output2;
  output_ptrs[2] = output3;
  data1[0] = '\x01';
  data1[1] = '#';
  data1[2] = 'E';
  data1[3] = 'g';
  data1[4] = 0x89;
  data1[5] = 0xab;
  data1[6] = 0xcd;
  data1[7] = 0xef;
  output1 = (uint8_t  [32])ZEXT1632(ZEXT816(0));
  output2 = (uint8_t  [32])ZEXT1632(ZEXT816(0));
  output3 = (uint8_t  [32])ZEXT1632(ZEXT816(0));
  output4 = (uint8_t  [32])ZEXT1632(ZEXT816(0));
  output_ptrs[3] = output4;
  data_ptrs[0] = data1;
  data_ptrs[1] = data2;
  data_ptrs[2] = data2;
  data_ptrs[3] = data1;
  hash_init_x4(&ctx,0x40);
  Keccak_HashUpdatetimes4(&ctx,data_ptrs,0x40);
  hash_final_x4(&ctx);
  Keccak_HashSqueezetimes4(&ctx,output_ptrs,0x100);
  out1[0] = '\0';
  out1[1] = '\0';
  out1[2] = '\0';
  out1[3] = '\0';
  out1[4] = '\0';
  out1[5] = '\0';
  out1[6] = '\0';
  out1[7] = '\0';
  out1[8] = '\0';
  out1[9] = '\0';
  out1[10] = '\0';
  out1[0xb] = '\0';
  out1[0xc] = '\0';
  out1[0xd] = '\0';
  out1[0xe] = '\0';
  out1[0xf] = '\0';
  out1[0x10] = '\0';
  out1[0x11] = '\0';
  out1[0x12] = '\0';
  out1[0x13] = '\0';
  out1[0x14] = '\0';
  out1[0x15] = '\0';
  out1[0x16] = '\0';
  out1[0x17] = '\0';
  out1[0x18] = '\0';
  out1[0x19] = '\0';
  out1[0x1a] = '\0';
  out1[0x1b] = '\0';
  out1[0x1c] = '\0';
  out1[0x1d] = '\0';
  out1[0x1e] = '\0';
  out1[0x1f] = '\0';
  out2[0] = '\0';
  out2[1] = '\0';
  out2[2] = '\0';
  out2[3] = '\0';
  out2[4] = '\0';
  out2[5] = '\0';
  out2[6] = '\0';
  out2[7] = '\0';
  out2[8] = '\0';
  out2[9] = '\0';
  out2[10] = '\0';
  out2[0xb] = '\0';
  out2[0xc] = '\0';
  out2[0xd] = '\0';
  out2[0xe] = '\0';
  out2[0xf] = '\0';
  out2[0x10] = '\0';
  out2[0x11] = '\0';
  out2[0x12] = '\0';
  out2[0x13] = '\0';
  out2[0x14] = '\0';
  out2[0x15] = '\0';
  out2[0x16] = '\0';
  out2[0x17] = '\0';
  out2[0x18] = '\0';
  out2[0x19] = '\0';
  out2[0x1a] = '\0';
  out2[0x1b] = '\0';
  out2[0x1c] = '\0';
  out2[0x1d] = '\0';
  out2[0x1e] = '\0';
  out2[0x1f] = '\0';
  hash_init(&ctx1,0x40);
  Keccak_HashUpdate(&ctx1,data1,0x40);
  hash_final(&ctx1);
  Keccak_HashSqueeze(&ctx1,out1,0x100);
  hash_init(&local_528,0x40);
  Keccak_HashUpdate(&local_528,data2,0x40);
  hash_final(&local_528);
  Keccak_HashSqueeze(&local_528,out2,0x100);
  auVar4[8] = out1[8];
  auVar4[9] = out1[9];
  auVar4[10] = out1[10];
  auVar4[0xb] = out1[0xb];
  auVar4[0xc] = out1[0xc];
  auVar4[0xd] = out1[0xd];
  auVar4[0xe] = out1[0xe];
  auVar4[0xf] = out1[0xf];
  auVar4[0] = out1[0];
  auVar4[1] = out1[1];
  auVar4[2] = out1[2];
  auVar4[3] = out1[3];
  auVar4[4] = out1[4];
  auVar4[5] = out1[5];
  auVar4[6] = out1[6];
  auVar4[7] = out1[7];
  auVar4[0x10] = out1[0x10];
  auVar4[0x11] = out1[0x11];
  auVar4[0x12] = out1[0x12];
  auVar4[0x13] = out1[0x13];
  auVar4[0x14] = out1[0x14];
  auVar4[0x15] = out1[0x15];
  auVar4[0x16] = out1[0x16];
  auVar4[0x17] = out1[0x17];
  auVar4[0x18] = out1[0x18];
  auVar4[0x19] = out1[0x19];
  auVar4[0x1a] = out1[0x1a];
  auVar4[0x1b] = out1[0x1b];
  auVar4[0x1c] = out1[0x1c];
  auVar4[0x1d] = out1[0x1d];
  auVar4[0x1e] = out1[0x1e];
  auVar4[0x1f] = out1[0x1f];
  if (((auVar4 == _DAT_00113060) &&
      (auVar2[8] = out2[8], auVar2[9] = out2[9], auVar2[10] = out2[10], auVar2[0xb] = out2[0xb],
      auVar2[0xc] = out2[0xc], auVar2[0xd] = out2[0xd], auVar2[0xe] = out2[0xe],
      auVar2[0xf] = out2[0xf], auVar2[0] = out2[0], auVar2[1] = out2[1], auVar2[2] = out2[2],
      auVar2[3] = out2[3], auVar2[4] = out2[4], auVar2[5] = out2[5], auVar2[6] = out2[6],
      auVar2[7] = out2[7], auVar2[0x10] = out2[0x10], auVar2[0x11] = out2[0x11],
      auVar2[0x12] = out2[0x12], auVar2[0x13] = out2[0x13], auVar2[0x14] = out2[0x14],
      auVar2[0x15] = out2[0x15], auVar2[0x16] = out2[0x16], auVar2[0x17] = out2[0x17],
      auVar2[0x18] = out2[0x18], auVar2[0x19] = out2[0x19], auVar2[0x1a] = out2[0x1a],
      auVar2[0x1b] = out2[0x1b], auVar2[0x1c] = out2[0x1c], auVar2[0x1d] = out2[0x1d],
      auVar2[0x1e] = out2[0x1e], auVar2[0x1f] = out2[0x1f], auVar2 == _DAT_00113080)) &&
     ((output1 == _DAT_00113060 && ((output2 == _DAT_00113080 && (output3 == _DAT_00113080)))))) {
    pcVar6 = "FAILED";
    if (output4 == _DAT_00113060) {
      pcVar6 = "OK";
    }
    iVar5 = -1;
    if (output4 == _DAT_00113060) {
      iVar5 = local_63c;
    }
  }
  else {
    pcVar6 = "FAILED";
    iVar5 = -1;
  }
  puts(pcVar6);
  printf("testing SHAKE128 with valgrind ...");
  puts("SKIPPED");
  return iVar5;
}

Assistant:

int main(void) {
  int ret = 0;

  printf("testing SHAKE128x4 ...");
  int r = test_shake128_x4();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  printf("testing SHAKE256x4 ...");
  r = test_shake256_x4();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  printf("testing SHAKE128 with valgrind ...");
  r = test_shake128_valgrind();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  return ret;
}